

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderLayeredRenderingFBONoAttachment::iterate
          (GeometryShaderLayeredRenderingFBONoAttachment *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  NotSupportedError *pNVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  TestError *pTVar9;
  GLint *pGVar10;
  undefined8 in_stack_fffffffffffff7d8;
  undefined4 uVar11;
  MessageBuilder local_670;
  int local_4ec;
  int iStack_4e8;
  int nPx;
  int referenceColor [4];
  undefined1 local_4d0 [4];
  int n_layer;
  int local_350;
  uint local_34c;
  GLint current_n_layers;
  uint n_test_iteration;
  undefined1 local_340 [3];
  GLboolean test_failed;
  int n;
  int local_1c0;
  int local_1bc;
  GLint height;
  GLint width;
  int local_38 [2];
  GLint nLayers;
  long local_28;
  Functions *gl;
  GeometryShaderLayeredRenderingFBONoAttachment *this_local;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffff7d8 >> 0x20);
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  local_28 = CONCAT44(extraout_var,iVar2);
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
               ,0xdc);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((this->super_TestCaseBase).m_is_framebuffer_no_attachments_supported & 1U) == 0) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,"framebuffer_no_attachment, is not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
               ,0xe1);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((this->super_TestCaseBase).m_is_shader_image_load_store_supported & 1U) == 0) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,"shader_image_load_store, is not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
               ,0xe6);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  (**(code **)(local_28 + 0x6d0))(1,&this->m_fbo_id);
  (**(code **)(local_28 + 0x78))(0x8ca9,this->m_fbo_id);
  local_38[0] = -1;
  (**(code **)(local_28 + 0x838))
            (0x8ca9,(this->super_TestCaseBase).m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS,local_38);
  dVar3 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar3,"Could not query a framebuffer object for the number of default layers!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                  ,0xf2);
  if (local_38[0] == 0) {
    local_1bc = 0;
    local_1c0 = 0;
    (**(code **)(local_28 + 0x678))(0x8ca9,0x9310,0x80);
    dVar3 = (**(code **)(local_28 + 0x800))();
    glu::checkError(dVar3,"Could not set the default framebuffer\'s width!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                    ,0x103);
    (**(code **)(local_28 + 0x838))(0x8ca9,0x9310,&local_1bc);
    dVar3 = (**(code **)(local_28 + 0x800))();
    glu::checkError(dVar3,"Could not get the default framebuffer\'s width!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                    ,0x105);
    (**(code **)(local_28 + 0x678))(0x8ca9,0x9311,0x80);
    dVar3 = (**(code **)(local_28 + 0x800))();
    glu::checkError(dVar3,"Could not set the default framebuffer\'s height!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                    ,0x107);
    (**(code **)(local_28 + 0x838))(0x8ca9,0x9311,&local_1c0);
    dVar3 = (**(code **)(local_28 + 0x800))();
    glu::checkError(dVar3,"Could not get the default framebuffer\'s height!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                    ,0x109);
    if ((local_1bc == 0x80) && (local_1c0 == 0x80)) {
      GVar4 = (**(code **)(local_28 + 0x3c8))();
      this->m_po_id = GVar4;
      GVar4 = (**(code **)(local_28 + 0x3f0))(0x8b31);
      this->m_vs_id = GVar4;
      GVar4 = (**(code **)(local_28 + 0x3f0))
                        ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
      this->m_gs_id = GVar4;
      GVar4 = (**(code **)(local_28 + 0x3f0))(0x8b30);
      this->m_fs_id = GVar4;
      bVar1 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&m_fs_code,
                         this->m_gs_id,1,&m_gs_code,this->m_vs_id,1,&m_vs_code,(bool *)0x0);
      if (!bVar1) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,
                   "Could not create program object from a valid vertex/geometry/fragment shader code!"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                   ,0x11e);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pGVar10 = (GLint *)operator_new__(0x100000);
      this->m_all_layers_data = pGVar10;
      for (n_test_iteration = 0; (int)n_test_iteration < 0x10000;
          n_test_iteration = n_test_iteration + 1) {
        this->m_all_layers_data[(int)(n_test_iteration << 2)] = 0xff;
        this->m_all_layers_data[(int)(n_test_iteration * 4 + 1)] = 0;
        this->m_all_layers_data[(int)(n_test_iteration * 4 + 2)] = 0;
        this->m_all_layers_data[(int)(n_test_iteration * 4 + 3)] = 0;
      }
      (**(code **)(local_28 + 0x6f8))(1,&this->m_to_id);
      (**(code **)(local_28 + 0xb8))(0x8c1a,this->m_to_id);
      (**(code **)(local_28 + 0x1398))(0x8c1a,1,0x8d82,0x80,0x80,4);
      (**(code **)(local_28 + 0x1350))(0x46180000,0x8c1a,0x2800);
      (**(code **)(local_28 + 0x1350))(0x46180000,0x8c1a,0x2801);
      dVar3 = (**(code **)(local_28 + 0x800))();
      glu::checkError(dVar3,"Error creating texture objects!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                      ,0x132);
      (**(code **)(local_28 + 0x1680))(this->m_po_id);
      dVar3 = (**(code **)(local_28 + 0x800))();
      glu::checkError(dVar3,"Could not use program!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                      ,0x136);
      (**(code **)(local_28 + 0x80))(0,this->m_to_id,0,1,0,0x88b9,CONCAT44(uVar11,0x8d82));
      dVar3 = (**(code **)(local_28 + 0x800))();
      glu::checkError(dVar3,"Could not bind texture to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                      ,0x13a);
      (**(code **)(local_28 + 0x708))(1,&this->m_vao_id);
      (**(code **)(local_28 + 0xd8))(this->m_vao_id);
      dVar3 = (**(code **)(local_28 + 0x800))();
      glu::checkError(dVar3,"Could not create a vertex array object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                      ,0x140);
      (**(code **)(local_28 + 0x1a00))(0,0,0x80);
      dVar3 = (**(code **)(local_28 + 0x800))();
      glu::checkError(dVar3,"glViewport() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                      ,0x144);
      current_n_layers._3_1_ = '\0';
      pGVar10 = (GLint *)operator_new__(0x40000);
      this->m_layer_data = pGVar10;
      for (local_34c = 0; local_34c < 2 && current_n_layers._3_1_ == '\0'; local_34c = local_34c + 1
          ) {
        local_350 = 4;
        if (local_34c == 1) {
          local_350 = 0;
        }
        (**(code **)(local_28 + 0x13c0))
                  (0x8c1a,0,0,0,0,0x80,0x80,4,0x8d99,0x1404,this->m_all_layers_data);
        dVar3 = (**(code **)(local_28 + 0x800))();
        glu::checkError(dVar3,"glTexSubImage3D() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x15a);
        (**(code **)(local_28 + 0x678))
                  (0x8ca9,(this->super_TestCaseBase).m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS,
                   local_350);
        dVar3 = (**(code **)(local_28 + 0x800))();
        glu::checkError(dVar3,"Could not set the default number of layers of a framebuffer object!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x15f);
        (**(code **)(local_28 + 0x838))
                  (0x8ca9,(this->super_TestCaseBase).m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS,
                   local_38);
        if (local_350 != local_38[0]) {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)local_4d0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar8 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_4d0,
                              (char (*) [41])"FBO\'s default layers should be equal to ");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&m_n_layers);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [8])0x2af111b);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_38);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_4d0);
          tcu::TestContext::setTestResult
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
          return STOP;
        }
        (**(code **)(local_28 + 0x538))(0,0,1);
        dVar3 = (**(code **)(local_28 + 0x800))();
        glu::checkError(dVar3,"Could not execute a draw call!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x170);
        (**(code **)(local_28 + 0x78))(0x8ca8,this->m_fbo_id);
        for (referenceColor[3] = 0; referenceColor[3] < 4 && current_n_layers._3_1_ == '\0';
            referenceColor[3] = referenceColor[3] + 1) {
          (**(code **)(local_28 + 0x6b8))(0x8ca8,0x8ce0,this->m_to_id,0,referenceColor[3]);
          dVar3 = (**(code **)(local_28 + 0x800))();
          glu::checkError(dVar3,"Could not bind texture as color attachment to framebuffer!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                          ,0x179);
          iVar2 = (**(code **)(local_28 + 0x170))(0x8ca8);
          if (iVar2 != 0x8cd5) {
            pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar9,"Read framebuffer is not complete!",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                       ,0x17d);
            __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          (**(code **)(local_28 + 0xdb8))(0x400);
          (**(code **)(local_28 + 0x1220))(0,0,0x80,0x80,0x8d99,0x1404,this->m_layer_data);
          dVar3 = (**(code **)(local_28 + 0x800))();
          glu::checkError(dVar3,
                          "Could not read back pixels from the texture bound to color attachment!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                          ,0x185);
          _iStack_4e8 = 0xff00000000;
          referenceColor[0] = 0;
          referenceColor[1] = 0;
          for (local_4ec = 0; local_4ec < 0x4000; local_4ec = local_4ec + 1) {
            if ((((this->m_layer_data[local_4ec << 2] != 0) ||
                 (this->m_layer_data[local_4ec * 4 + 1] != 0xff)) ||
                (this->m_layer_data[local_4ec * 4 + 2] != 0)) ||
               (this->m_layer_data[local_4ec * 4 + 3] != 0)) {
              pTVar7 = tcu::TestContext::getLog
                                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                                 );
              tcu::TestLog::operator<<
                        (&local_670,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (&local_670,(char (*) [24])"The test failed: Pixel ");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4ec);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])" from layer ");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,referenceColor + 3);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])" is set to [");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,this->m_layer_data + (local_4ec << 2))
              ;
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c5c975);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,this->m_layer_data + (local_4ec * 4 + 1));
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c5c975);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,this->m_layer_data + (local_4ec * 4 + 2));
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c5c975);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,this->m_layer_data + (local_4ec * 4 + 3));
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(char (*) [27])"] but should be equal to [");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&iStack_4e8);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c5c975);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&nPx);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c5c975);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,referenceColor);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c5c975);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,referenceColor + 1);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c5c975);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29dc08e);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_670);
              current_n_layers._3_1_ = '\x01';
              break;
            }
          }
        }
        (**(code **)(local_28 + 0x6b8))(0x8ca8,0x8ce0,0,0);
      }
      if (current_n_layers._3_1_ == '\0') {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
    }
    else {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_340,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_340,
                          (char (*) [51])"Framebuffer\'s default width/height is not equal to");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&m_width);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c7a37c);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&m_height);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])0x2af111a);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1bc);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c7a37c);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1c0);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_340);
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
    }
  }
  else {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&height,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&height,
                        (char (*) [54])"Number of default layers should be equal to 0 but is ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_38);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&height);
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredRenderingFBONoAttachment::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check if required extensions are supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	if (!m_is_framebuffer_no_attachments_supported)
	{
		throw tcu::NotSupportedError("framebuffer_no_attachment, is not supported", "", __FILE__, __LINE__);
	}

	if (!m_is_shader_image_load_store_supported)
	{
		throw tcu::NotSupportedError("shader_image_load_store, is not supported", "", __FILE__, __LINE__);
	}

	/* Generate and bind a framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);

	/* Get the default number of layers of a newly created framebuffer object */
	glw::GLint nLayers = -1;

	gl.getFramebufferParameteriv(GL_DRAW_FRAMEBUFFER, m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS, &nLayers);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query a framebuffer object for the number of default layers!");

	/* check 14.2 test condition - if default number of layer equals 0 */
	if (nLayers != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Number of default layers should be equal to 0 but is "
						   << nLayers << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* Set the default resolution to 128x128 */
	glw::GLint width  = 0;
	glw::GLint height = 0;

	gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_WIDTH, m_width);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set the default framebuffer's width!");
	gl.getFramebufferParameteriv(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_WIDTH, &width);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get the default framebuffer's width!");
	gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_HEIGHT, m_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set the default framebuffer's height!");
	gl.getFramebufferParameteriv(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_HEIGHT, &height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get the default framebuffer's height!");

	if (m_width != width || m_height != height)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Framebuffer's default width/height is not equal to" << m_width
						   << "\\" << m_height << " but is " << width << "\\" << height << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* Configure program object to be used for functional part of the test */
	m_po_id = gl.createProgram();

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &m_fs_code, m_gs_id, 1 /* part */, &m_gs_code, m_vs_id,
					  1 /* part */, &m_vs_code))
	{
		TCU_FAIL("Could not create program object from a valid vertex/geometry/fragment shader code!");
	}

	/* Configure texture objects and fill them with initial data */
	m_all_layers_data = new glw::GLint[m_n_layers * m_width * m_height * m_n_texture_components];

	for (int n = 0; n < m_n_layers * m_width * m_height; ++n)
	{
		m_all_layers_data[n * m_n_texture_components + 0] = 255;
		m_all_layers_data[n * m_n_texture_components + 1] = 0;
		m_all_layers_data[n * m_n_texture_components + 2] = 0;
		m_all_layers_data[n * m_n_texture_components + 3] = 0;
	}

	gl.genTextures(1, &m_to_id);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_id);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1 /* levels */, GL_RGBA32I, m_width, m_height, m_n_layers);
	gl.texParameterf(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameterf(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating texture objects!");

	/* Activate the test program object */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program!");

	/* Bind texture to image unit */
	gl.bindImageTexture(0, m_to_id, 0 /* level */, GL_TRUE, 0 /* layer */, GL_WRITE_ONLY, GL_RGBA32I);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind texture to image unit!");

	/* Generate & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a vertex array object!");

	/* Set up the viewport */
	gl.viewport(0 /* x */, 0 /* y */, m_width /* width */, m_height /* height */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	/* Test 21.4 adjusts the behavior of the original tests. The test now needs to run
	 * in two iterations:
	 *
	 * a) Original behavior is left intact
	 * b) GL_FRAMEBUFFER_DEFAULT_LAYERS_EXT should be set to 0.
	 */
	glw::GLboolean test_failed = false;

	m_layer_data = new glw::GLint[m_width * m_height * m_n_texture_components];

	for (unsigned int n_test_iteration = 0; n_test_iteration < 2 && !test_failed; ++n_test_iteration)
	{
		const glw::GLint current_n_layers = (n_test_iteration == 1) ? 0 : m_n_layers;

		/* Reset render-target contents */
		gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0, /* level   */
						 0,						 /* xoffset */
						 0,						 /* yoffset */
						 0,						 /* zoffset */
						 m_width, m_height, m_n_layers, GL_RGBA_INTEGER, GL_INT, m_all_layers_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexSubImage3D() call failed.");

		/* Set the default number of layers to m_n_layers */
		gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS, current_n_layers);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set the default number of layers of a framebuffer object!");

		gl.getFramebufferParameteriv(GL_DRAW_FRAMEBUFFER, m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS, &nLayers);

		/* check if the reported value equals m_n_layers */
		if (current_n_layers != nLayers)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "FBO's default layers should be equal to " << m_n_layers
							   << "but is " << nLayers << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		/* Render! */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not execute a draw call!");

		/* Verify result texture data */
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);

		for (int n_layer = 0; n_layer < m_n_layers && !test_failed; ++n_layer)
		{
			gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, 0 /* level */, n_layer);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind texture as color attachment to framebuffer!");

			if (gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			{
				TCU_FAIL("Read framebuffer is not complete!");
			}

			gl.memoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);

			gl.readPixels(0 /* x */, 0 /* y */, m_width, m_height, GL_RGBA_INTEGER, GL_INT, m_layer_data);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								"Could not read back pixels from the texture bound to color attachment!");

			/* Perform the verification */
			const int referenceColor[4] = { 0, 255, 0, 0 };

			for (int nPx = 0; nPx < m_width * m_height; ++nPx)
			{
				if (m_layer_data[nPx * m_n_texture_components + 0] != referenceColor[0] ||
					m_layer_data[nPx * m_n_texture_components + 1] != referenceColor[1] ||
					m_layer_data[nPx * m_n_texture_components + 2] != referenceColor[2] ||
					m_layer_data[nPx * m_n_texture_components + 3] != referenceColor[3])
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "The test failed: Pixel " << nPx << " from layer "
									   << n_layer << " is set to [" << m_layer_data[nPx * m_n_texture_components + 0]
									   << "," << m_layer_data[nPx * m_n_texture_components + 1] << ","
									   << m_layer_data[nPx * m_n_texture_components + 2] << ","
									   << m_layer_data[nPx * m_n_texture_components + 3] << "] but should be equal to ["
									   << referenceColor[0] << "," << referenceColor[1] << "," << referenceColor[2]
									   << "," << referenceColor[3] << ","
									   << "]" << tcu::TestLog::EndMessage;

					test_failed = true;
					break;
				} /* if (result pixel is invalid) */
			}	 /* for (all pixels) */
		}		  /* for (all layers) */

		/* Restore the FBO to no-attachment state for the next iteration */
		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, 0, 0, 0);

	} /* for (both iterations) */

	if (test_failed)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}